

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Input::setError(Input *this,HNode *hnode,Twine *message)

{
  if (hnode != (HNode *)0x0) {
    setError(this,hnode->_node,message);
    return;
  }
  __assert_fail("hnode && \"HNode must not be NULL\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLTraits.cpp"
                ,0x160,"void llvm::yaml::Input::setError(HNode *, const Twine &)");
}

Assistant:

void Input::setError(HNode *hnode, const Twine &message) {
  assert(hnode && "HNode must not be NULL");
  setError(hnode->_node, message);
}